

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_reset(ZSTD_CCtx *cctx,ZSTD_ResetDirective reset)

{
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    cctx->streamStage = zcss_init;
    cctx->pledgedSrcSizePlusOne = 0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    if (cctx->streamStage != zcss_init) {
      return 0xffffffffffffffc4;
    }
    cctx->cdict = (ZSTD_CDict *)0x0;
    (cctx->requestedParams).fParams.contentSizeFlag = 0;
    (cctx->requestedParams).fParams.checksumFlag = 0;
    *(undefined8 *)&(cctx->requestedParams).fParams.noDictIDFlag = 0;
    (cctx->requestedParams).format = ZSTD_f_zstd1;
    (cctx->requestedParams).cParams.windowLog = 0;
    (cctx->requestedParams).cParams.chainLog = 0;
    (cctx->requestedParams).cParams.hashLog = 0;
    (cctx->requestedParams).cParams.searchLog = 0;
    (cctx->requestedParams).cParams.minMatch = 0;
    (cctx->requestedParams).cParams.targetLength = 0;
    (cctx->requestedParams).cParams.strategy = 0;
    (cctx->requestedParams).forceWindow = 0;
    (cctx->requestedParams).attachDictPref = ZSTD_dictDefaultAttach;
    *(undefined8 *)&(cctx->requestedParams).nbWorkers = 0;
    (cctx->requestedParams).jobSize = 0;
    (cctx->requestedParams).overlapLog = 0;
    (cctx->requestedParams).rsyncable = 0;
    (cctx->requestedParams).ldmParams.enableLdm = 0;
    (cctx->requestedParams).ldmParams.hashLog = 0;
    (cctx->requestedParams).ldmParams.bucketSizeLog = 0;
    (cctx->requestedParams).ldmParams.minMatchLength = 0;
    (cctx->requestedParams).ldmParams.hashRateLog = 0;
    (cctx->requestedParams).ldmParams.windowLog = 0;
    (cctx->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)0x0;
    (cctx->requestedParams).customMem.customFree = (ZSTD_freeFunction)0x0;
    (cctx->requestedParams).customMem.opaque = (void *)0x0;
    (cctx->requestedParams).compressionLevel = 3;
    (cctx->requestedParams).fParams.contentSizeFlag = 1;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
        cctx->cdict = NULL;
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}